

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::
make_next_inequality_node(branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *this)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  reference pvVar6;
  value_type *pvVar7;
  reference pvVar8;
  int local_44;
  double local_40;
  reference local_38;
  node *node_1;
  uint variables;
  int sumfactor;
  double sumr;
  reference pvStack_18;
  uint level;
  node *node_0;
  branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *this_local;
  
  node_0 = (node *)this;
  pvStack_18 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
               ::back(&this->nodes);
  uVar4 = pvStack_18->level + 1;
  sumr._4_4_ = uVar4;
  sVar5 = shared_subvector::element_size(&this->subvector);
  if (uVar4 < sVar5) {
    pvStack_18->level = sumr._4_4_;
    pvStack_18->z = pvStack_18->sumr;
    uVar4 = sumr._4_4_ + 1;
    sVar5 = shared_subvector::element_size(&this->subvector);
    if (uVar4 < sVar5) {
      pvVar6 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
               ::operator[](&this->items,(ulong)(sumr._4_4_ + 1));
      pvStack_18->z = pvVar6->sum_z + pvStack_18->z;
    }
    dVar1 = pvStack_18->sumr;
    node_1._4_4_ = pvStack_18->sumfactor;
    node_1._0_4_ = pvStack_18->variables;
    _variables = dVar1;
    pvVar6 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
             ::operator[](&this->items,(ulong)sumr._4_4_);
    iVar2 = node_1._4_4_;
    local_40 = dVar1 + pvVar6->r;
    pvVar6 = std::
             vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
             ::operator[](&this->items,(ulong)sumr._4_4_);
    local_44 = iVar2 + pvVar6->factor;
    local_38 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::node>>
               ::emplace_back<double,int,unsigned_int_const&>
                         ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,double>::node>>
                           *)&this->nodes,&local_40,&local_44,(uint *)((long)&sumr + 4));
    sVar5 = shared_subvector::emplace(&this->subvector);
    local_38->variables = sVar5;
    shared_subvector::copy
              (&this->subvector,(EVP_PKEY_CTX *)(ulong)(uint)node_1,
               (EVP_PKEY_CTX *)(ulong)local_38->variables);
    pvVar7 = shared_subvector::operator[](&this->subvector,local_38->variables + sumr._4_4_);
    *pvVar7 = '\x01';
    uVar4 = sumr._4_4_ + 1;
    sVar5 = shared_subvector::element_size(&this->subvector);
    if (uVar4 < sVar5) {
      dVar1 = local_38->sumr;
      pvVar6 = std::
               vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
               ::operator[](&this->items,(ulong)(sumr._4_4_ + 1));
      local_38->z = dVar1 + pvVar6->sum_z;
    }
    if ((local_38->sumfactor < this->b_min) || (this->b_max < local_38->sumfactor)) {
      if (this->b_max < local_38->sumfactor) {
        shared_subvector::remove(&this->subvector,(char *)(ulong)local_38->variables);
        std::
        vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
        ::pop_back(&this->nodes);
      }
    }
    else {
      bVar3 = is_best_solution(this,local_38->sumr);
      if (bVar3) {
        shared_subvector::copy
                  (&this->subvector,(EVP_PKEY_CTX *)(ulong)(uint)node_1,
                   (EVP_PKEY_CTX *)(ulong)this->solution);
        shared_subvector::invert(&this->subvector,this->solution,sumr._4_4_);
        pvVar8 = std::
                 vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
                 ::back(&this->nodes);
        this->lower_bound = pvVar8->sumr;
      }
    }
  }
  else {
    shared_subvector::remove(&this->subvector,(char *)(ulong)pvStack_18->variables);
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
    ::pop_back(&this->nodes);
  }
  return;
}

Assistant:

void make_next_inequality_node()
    {
        node& node_0 = nodes.back();

        const unsigned level = node_0.level + 1;
        if (level >= subvector.element_size()) {
            subvector.remove(node_0.variables);
            nodes.pop_back();
            return;
        }

        node_0.level = level;
        node_0.z = node_0.sumr;

        if (level + 1 < subvector.element_size())
            node_0.z += items[level + 1].sum_z;

        const Float sumr = node_0.sumr;
        const int sumfactor = node_0.sumfactor;
        const unsigned int variables = node_0.variables;

        node& node_1 = nodes.emplace_back(
          sumr + items[level].r, sumfactor + items[level].factor, level);
        node_1.variables = subvector.emplace();
        subvector.copy(variables, node_1.variables);
        subvector[node_1.variables + level] = 1;
        if (level + 1 < subvector.element_size())
            node_1.z = node_1.sumr + items[level + 1].sum_z;

        if (b_min <= node_1.sumfactor && node_1.sumfactor <= b_max) {
            if (is_best_solution(node_1.sumr)) {
                subvector.copy(variables, solution);
                subvector.invert(solution, level);
                lower_bound = nodes.back().sumr;
            }
        } else if (node_1.sumfactor > b_max) {
            subvector.remove(node_1.variables);
            nodes.pop_back();
        }
    }